

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_TestUnpackWithTypeMismatch_Test::TestBody
          (AnyTest_TestUnpackWithTypeMismatch_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_418;
  AssertHelper local_3f8;
  Message local_3f0;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_;
  TestAllTypes dest;
  Any any;
  undefined1 local_58 [8];
  TestAny payload;
  AnyTest_TestUnpackWithTypeMismatch_Test *this_local;
  
  payload.field_0._48_8_ = this;
  proto2_unittest::TestAny::TestAny((TestAny *)local_58);
  proto2_unittest::TestAny::set_int32_value((TestAny *)local_58,0xd);
  Any::Any((Any *)((long)&dest.field_0 + 0x328));
  Any::PackFrom((Any *)((long)&dest.field_0 + 0x328),(Message *)local_58);
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&gtest_ar_.message_);
  bVar1 = Any::UnpackTo((Any *)((long)&dest.field_0 + 0x328),(Message *)&gtest_ar_.message_);
  local_3e1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_418,(internal *)local_3e0,(AssertionResult *)"any.UnpackTo(&dest)","true",
               "false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
               ,0x3d,message);
    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&gtest_ar_.message_);
  Any::~Any((Any *)((long)&dest.field_0 + 0x328));
  proto2_unittest::TestAny::~TestAny((TestAny *)local_58);
  return;
}

Assistant:

TEST(AnyTest, TestUnpackWithTypeMismatch) {
  proto2_unittest::TestAny payload;
  payload.set_int32_value(13);
  google::protobuf::Any any;
  any.PackFrom(payload);

  // Attempt to unpack into the wrong type.
  proto2_unittest::TestAllTypes dest;
  EXPECT_FALSE(any.UnpackTo(&dest));
}